

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_2c78e2::ValueSetter::writeAppearance(ValueSetter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer __s2;
  size_t sVar4;
  size_t __n;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long *plVar9;
  undefined8 *puVar10;
  undefined1 trim_trailing_zeroes;
  uint uVar11;
  ulong uVar12;
  ulong *puVar13;
  long *plVar14;
  void *__buf;
  type ii;
  size_type *psVar15;
  undefined8 uVar16;
  _Alloc_hider _Var17;
  ulong uVar18;
  type ii_1;
  int i;
  long lVar19;
  char cVar20;
  uint uVar21;
  ulong i_00;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  long *local_1f0;
  void *local_1e8;
  long local_1e0;
  long lStack_1d8;
  double local_1d0;
  ulong local_1c8;
  string local_1c0;
  ValueSetter *local_1a0;
  string local_198;
  string local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  double local_138;
  ulong uStack_130;
  long *local_128;
  undefined8 local_120;
  long local_118;
  undefined8 uStack_110;
  double local_108;
  double dStack_100;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  string local_d0;
  string local_b0;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  this->replaced = true;
  local_138 = this->tf * 1.2;
  uStack_130 = 0;
  dVar22 = ((this->bbox).ury - (this->bbox).lly) / local_138;
  uVar8 = (ulong)dVar22;
  uVar12 = (long)uVar8 >> 0x3f;
  uVar8 = (long)(dVar22 - 9.223372036854776e+18) & uVar12 | uVar8;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar2 = (this->opt).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->opt).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  cVar20 = uVar8 < 2 || pbVar2 == pbVar3;
  local_1a0 = this;
  if (uVar8 >= 2 && pbVar2 != pbVar3) {
    local_1d0 = (double)CONCAT71(local_1d0._1_7_,cVar20);
    local_1c8 = (long)pbVar3 - (long)pbVar2 >> 5;
    __s2 = (this->V)._M_dataplus._M_p;
    sVar4 = (this->V)._M_string_length;
    uVar18 = local_1c8 + (local_1c8 == 0);
    psVar15 = &pbVar2->_M_string_length;
    i_00 = 0;
    local_108 = (double)uVar8;
LAB_0016e42b:
    __n = *psVar15;
    if ((__n != sVar4) ||
       ((__n != 0 &&
        (iVar5 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (psVar15 + -1))->_M_dataplus)._M_p,__s2,__n), iVar5 != 0))))
    goto LAB_0016e451;
    if (i_00 >> 0x1f != 0) {
      QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i_00);
    }
    uVar18 = local_1c8;
    uVar8 = uVar8 + i_00;
    if ((uVar8 & 0xffffffff80000000) != 0) {
      QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar8);
    }
    uVar21 = (uint)i_00;
    uVar11 = 1;
    if ((int)uVar21 < 1) {
      uVar11 = uVar21;
    }
    iVar5 = uVar21 - 1;
    if ((int)uVar21 < 1) {
      iVar5 = 0;
    }
    if (0x7fffffff < uVar18) {
      QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar18);
    }
    i = (int)uVar8 + ~uVar11;
    if ((int)uVar18 <= i) {
      if (uVar18 >> 0x1f != 0) {
        QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar18);
      }
      uVar11 = 1;
      if ((int)uVar21 < 1) {
        uVar11 = uVar21;
      }
      uVar11 = uVar11 + (int)uVar18;
      uVar12 = (ulong)uVar11;
      uVar6 = 1;
      if (1 < (int)uVar21) {
        uVar6 = uVar21;
      }
      iVar7 = (uVar6 + ~SUB84(local_108,0) + uVar11) - uVar21;
      iVar5 = 0;
      if (0 < iVar7) {
        iVar5 = iVar7;
      }
      i = i - ((SUB84(local_108,0) - uVar11) + uVar21);
    }
    uVar8 = (ulong)iVar5;
    lVar19 = uVar8 << 5;
    local_1c8 = uVar8;
    while( true ) {
      if (i < 0) {
        QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(i);
      }
      trim_trailing_zeroes = (undefined1)uVar12;
      if ((ulong)(long)i < uVar8) break;
      pbVar2 = (local_1a0->opt).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_1a0->opt).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar8) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                  );
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_158,(value_type *)((long)&(pbVar2->_M_dataplus)._M_p + lVar19));
      uVar8 = uVar8 + 1;
      lVar19 = lVar19 + 0x20;
    }
    lVar19 = (i_00 - local_1c8) + 1;
    auVar23._8_4_ = (int)((ulong)lVar19 >> 0x20);
    auVar23._0_8_ = lVar19;
    auVar23._12_4_ = 0x45300000;
    dStack_100 = auVar23._8_8_ - 1.9342813113834067e+25;
    local_108 = dStack_100 + ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0);
    this = local_1a0;
    goto LAB_0016e621;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_158,&this->V);
  trim_trailing_zeroes = (undefined1)uVar12;
  local_108 = 1.0;
  dStack_100 = 0.0;
LAB_0016e626:
  pbVar3 = local_158.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = local_158.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dVar22 = (this->bbox).ury;
  local_1c8 = (long)local_158.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_158.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
  auVar24._8_4_ =
       (int)((long)local_158.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_158.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 0x25);
  auVar24._0_8_ = local_1c8;
  auVar24._12_4_ = 0x45300000;
  local_1d0 = ((dVar22 - (this->bbox).lly) -
              ((auVar24._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_1c8) - 4503599627370496.0)) * local_138) *
              -0.5 + dVar22;
  if (cVar20 != '\0') goto LAB_0016ecf6;
  QUtil::double_to_string_abi_cxx11_
            (&local_50,(QUtil *)0x0,(this->bbox).llx,1,(bool)trim_trailing_zeroes);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x265683);
  plVar14 = plVar9 + 2;
  if ((long *)*plVar9 == plVar14) {
    local_60 = *plVar14;
    lStack_58 = plVar9[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar14;
    local_70 = (long *)*plVar9;
  }
  local_68 = plVar9[1];
  *plVar9 = (long)plVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar13 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar13) {
    local_e0 = *puVar13;
    lStack_d8 = plVar9[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar13;
    local_f0 = (ulong *)*plVar9;
  }
  local_e8 = plVar9[1];
  *plVar9 = (long)puVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  QUtil::double_to_string_abi_cxx11_
            (&local_90,(QUtil *)0x0,((this->bbox).lly + local_1d0) - local_108 * local_138,1,
             SUB81(puVar13,0));
  uVar8 = 0xf;
  if (local_f0 != &local_e0) {
    uVar8 = local_e0;
  }
  if (uVar8 < local_90._M_string_length + local_e8) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar16 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_90._M_string_length + local_e8) goto LAB_0016e816;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_0016e816:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_90._M_dataplus._M_p);
  }
  local_128 = &local_118;
  plVar9 = puVar10 + 2;
  if ((long *)*puVar10 == plVar9) {
    local_118 = *plVar9;
    uStack_110 = puVar10[3];
  }
  else {
    local_118 = *plVar9;
    local_128 = (long *)*puVar10;
  }
  local_120 = puVar10[1];
  *puVar10 = plVar9;
  puVar10[1] = 0;
  *(undefined1 *)plVar9 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_128);
  puVar13 = (ulong *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_198.field_2._M_allocated_capacity = *puVar13;
    local_198.field_2._8_8_ = plVar9[3];
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  }
  else {
    local_198.field_2._M_allocated_capacity = *puVar13;
    local_198._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_198._M_string_length = plVar9[1];
  *plVar9 = (long)puVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  QUtil::double_to_string_abi_cxx11_
            (&local_b0,(QUtil *)0x0,(this->bbox).urx - (this->bbox).llx,1,SUB81(puVar13,0));
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    uVar16 = local_198.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_b0._M_string_length + local_198._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar16 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_b0._M_string_length + local_198._M_string_length) goto LAB_0016e96f;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_b0,0,(char *)0x0,(ulong)local_198._M_dataplus._M_p);
  }
  else {
LAB_0016e96f:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_b0._M_dataplus._M_p);
  }
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  puVar13 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_178.field_2._M_allocated_capacity = *puVar13;
    local_178.field_2._8_8_ = puVar10[3];
  }
  else {
    local_178.field_2._M_allocated_capacity = *puVar13;
    local_178._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_178._M_string_length = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
  paVar1 = &local_1c0.field_2;
  puVar13 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_1c0.field_2._M_allocated_capacity = *puVar13;
    local_1c0.field_2._8_8_ = puVar10[3];
    local_1c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *puVar13;
    local_1c0._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_1c0._M_string_length = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  QUtil::double_to_string_abi_cxx11_(&local_d0,(QUtil *)0x0,local_138,1,SUB81(puVar13,0));
  uVar8 = (long)(_func_int ***)local_1c0._M_string_length + local_d0._M_string_length;
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    uVar16 = local_1c0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < uVar8) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar16 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < uVar8) goto LAB_0016eaaf;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_d0,0,(char *)0x0,(ulong)local_1c0._M_dataplus._M_p);
  }
  else {
LAB_0016eaaf:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_d0._M_dataplus._M_p);
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  psVar15 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_210.field_2._M_allocated_capacity = *psVar15;
    local_210.field_2._8_8_ = puVar10[3];
  }
  else {
    local_210.field_2._M_allocated_capacity = *psVar15;
    local_210._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_210._M_string_length = puVar10[1];
  *puVar10 = psVar15;
  puVar10[1] = 0;
  *(undefined1 *)psVar15 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_210);
  plVar14 = plVar9 + 2;
  if ((long *)*plVar9 == plVar14) {
    local_1e0 = *plVar14;
    lStack_1d8 = plVar9[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *plVar14;
    local_1f0 = (long *)*plVar9;
  }
  local_1e8 = (void *)plVar9[1];
  *plVar9 = (long)plVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  QPDFObjectHandle::TokenFilter::write
            (&local_1a0->super_TokenFilter,(int)&local_1f0,local_1e8,(size_t)plVar14);
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  this = local_1a0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
LAB_0016ecf6:
  local_1d0 = local_1d0 - this->tf;
  std::operator+(&local_210,"q\nBT\n",&this->DA);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_210);
  plVar14 = plVar9 + 2;
  if ((long *)*plVar9 == plVar14) {
    local_1e0 = *plVar14;
    lStack_1d8 = plVar9[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *plVar14;
    local_1f0 = (long *)*plVar9;
  }
  local_1e8 = (void *)plVar9[1];
  *plVar9 = (long)plVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  QPDFObjectHandle::TokenFilter::write
            (&this->super_TokenFilter,(int)&local_1f0,local_1e8,(size_t)plVar14);
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if (pbVar3 != pbVar2) {
    local_138 = -local_138;
    uStack_130 = uStack_130 ^ 0x8000000000000000;
    local_1c8 = local_1c8 + (local_1c8 == 0);
    lVar19 = 0;
    uVar8 = 0;
    do {
      if (uVar8 == 0) {
        QUtil::double_to_string_abi_cxx11_
                  (&local_178,(QUtil *)0x0,(this->bbox).llx + 1.0,1,SUB81(plVar14,0));
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_1c0.field_2._M_allocated_capacity = *puVar13;
          local_1c0.field_2._8_8_ = puVar10[3];
        }
        else {
          local_1c0.field_2._M_allocated_capacity = *puVar13;
          local_1c0._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_1c0._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        QUtil::double_to_string_abi_cxx11_
                  (&local_198,(QUtil *)0x0,(this->bbox).lly + local_1d0,1,SUB81(puVar13,0));
        uVar16 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          uVar16 = local_1c0.field_2._M_allocated_capacity;
        }
        uVar12 = (long)(_func_int ***)local_1c0._M_string_length + local_198._M_string_length;
        if ((ulong)uVar16 < uVar12) {
          uVar16 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            uVar16 = local_198.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar16 < uVar12) goto LAB_0016f016;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_198,0,(char *)0x0,(ulong)local_1c0._M_dataplus._M_p);
        }
        else {
LAB_0016f016:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_1c0,(ulong)local_198._M_dataplus._M_p);
        }
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        psVar15 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_210.field_2._M_allocated_capacity = *psVar15;
          local_210.field_2._8_8_ = puVar10[3];
        }
        else {
          local_210.field_2._M_allocated_capacity = *psVar15;
          local_210._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_210._M_string_length = puVar10[1];
        *puVar10 = psVar15;
        puVar10[1] = 0;
        *(undefined1 *)psVar15 = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
        plVar9 = puVar10 + 2;
        if ((long *)*puVar10 == plVar9) {
          local_1e0 = *plVar9;
          lStack_1d8 = puVar10[3];
          local_1f0 = &local_1e0;
        }
        else {
          local_1e0 = *plVar9;
          local_1f0 = (long *)*puVar10;
        }
        local_1e8 = (void *)puVar10[1];
        *puVar10 = plVar9;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        QPDFObjectHandle::TokenFilter::write
                  (&this->super_TokenFilter,(int)&local_1f0,local_1e8,(size_t)plVar9);
        if (local_1f0 != &local_1e0) {
          operator_delete(local_1f0,local_1e0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        uVar16 = local_178.field_2._M_allocated_capacity;
        _Var17._M_p = local_178._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) goto LAB_0016f176;
      }
      else {
        QUtil::double_to_string_abi_cxx11_(&local_1c0,(QUtil *)0x0,local_138,1,SUB81(plVar14,0));
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,0x2656ac);
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        psVar15 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_210.field_2._M_allocated_capacity = *psVar15;
          local_210.field_2._8_8_ = puVar10[3];
        }
        else {
          local_210.field_2._M_allocated_capacity = *psVar15;
          local_210._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_210._M_string_length = puVar10[1];
        *puVar10 = psVar15;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
        plVar9 = puVar10 + 2;
        if ((long *)*puVar10 == plVar9) {
          local_1e0 = *plVar9;
          lStack_1d8 = puVar10[3];
          local_1f0 = &local_1e0;
        }
        else {
          local_1e0 = *plVar9;
          local_1f0 = (long *)*puVar10;
        }
        local_1e8 = (void *)puVar10[1];
        *puVar10 = plVar9;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        QPDFObjectHandle::TokenFilter::write
                  (&this->super_TokenFilter,(int)&local_1f0,local_1e8,(size_t)plVar9);
        if (local_1f0 != &local_1e0) {
          operator_delete(local_1f0,local_1e0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        uVar16 = local_1c0.field_2._M_allocated_capacity;
        _Var17._M_p = local_1c0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
LAB_0016f176:
          operator_delete(_Var17._M_p,uVar16 + 1);
        }
      }
      if ((ulong)((long)local_158.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_158.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar8) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                  );
      }
      QPDFObjectHandle::newString
                ((QPDFObjectHandle *)&local_1c0,
                 (string *)
                 ((long)&((local_158.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar19));
      QPDFObjectHandle::unparse_abi_cxx11_(&local_210,(QPDFObjectHandle *)&local_1c0);
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
      plVar14 = puVar10 + 2;
      if ((long *)*puVar10 == plVar14) {
        local_1e0 = *plVar14;
        lStack_1d8 = puVar10[3];
        local_1f0 = &local_1e0;
      }
      else {
        local_1e0 = *plVar14;
        local_1f0 = (long *)*puVar10;
      }
      local_1e8 = (void *)puVar10[1];
      *puVar10 = plVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      QPDFObjectHandle::TokenFilter::write
                (&this->super_TokenFilter,(int)&local_1f0,local_1e8,(size_t)plVar14);
      if (local_1f0 != &local_1e0) {
        operator_delete(local_1f0,local_1e0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._M_string_length);
      }
      uVar8 = uVar8 + 1;
      lVar19 = lVar19 + 0x20;
    } while (local_1c8 != uVar8);
  }
  local_1f0 = &local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"ET\nQ\nEMC","");
  QPDFObjectHandle::TokenFilter::write
            (&this->super_TokenFilter,(int)&local_1f0,__buf,(size_t)plVar14);
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158);
  return;
LAB_0016e451:
  this = local_1a0;
  i_00 = i_00 + 1;
  psVar15 = psVar15 + 4;
  if (uVar18 == i_00) goto code_r0x0016e45d;
  goto LAB_0016e42b;
code_r0x0016e45d:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_158,&local_1a0->V);
  trim_trailing_zeroes = (undefined1)uVar12;
  uVar18 = uVar8 - 1;
  if (local_1c8 < uVar8 - 1) {
    uVar18 = local_1c8;
  }
  local_108 = 1.0;
  dStack_100 = 0.0;
  if (uVar18 != 0) {
    lVar19 = 0;
    uVar8 = 0;
    do {
      pbVar2 = (local_1a0->opt).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_1a0->opt).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar8) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                  );
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_158,(value_type *)((long)&(pbVar2->_M_dataplus)._M_p + lVar19));
      trim_trailing_zeroes = (undefined1)uVar12;
      uVar8 = uVar8 + 1;
      lVar19 = lVar19 + 0x20;
      this = local_1a0;
    } while (uVar18 != uVar8);
  }
LAB_0016e621:
  cVar20 = local_1d0._0_1_;
  goto LAB_0016e626;
}

Assistant:

void
ValueSetter::writeAppearance()
{
    this->replaced = true;

    // This code does not take quadding into consideration because doing so requires font metric
    // information, which we don't have in many cases.

    double tfh = 1.2 * tf;
    int dx = 1;

    // Write one or more lines, centered vertically, possibly with one row highlighted.

    auto max_rows = static_cast<size_t>((bbox.ury - bbox.lly) / tfh);
    bool highlight = false;
    size_t highlight_idx = 0;

    std::vector<std::string> lines;
    if (opt.empty() || (max_rows < 2)) {
        lines.push_back(V);
    } else {
        // Figure out what rows to write
        size_t nopt = opt.size();
        size_t found_idx = 0;
        bool found = false;
        for (found_idx = 0; found_idx < nopt; ++found_idx) {
            if (opt.at(found_idx) == V) {
                found = true;
                break;
            }
        }
        if (found) {
            // Try to make the found item the second one, but adjust for under/overflow.
            int wanted_first = QIntC::to_int(found_idx) - 1;
            int wanted_last = QIntC::to_int(found_idx + max_rows) - 2;
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper list found");
            if (wanted_first < 0) {
                QTC::TC("qpdf", "QPDFFormFieldObjectHelper list first too low");
                wanted_last -= wanted_first;
                wanted_first = 0;
            }
            if (wanted_last >= QIntC::to_int(nopt)) {
                QTC::TC("qpdf", "QPDFFormFieldObjectHelper list last too high");
                auto diff = wanted_last - QIntC::to_int(nopt) + 1;
                wanted_first = std::max(0, wanted_first - diff);
                wanted_last -= diff;
            }
            highlight = true;
            highlight_idx = found_idx - QIntC::to_size(wanted_first);
            for (size_t i = QIntC::to_size(wanted_first); i <= QIntC::to_size(wanted_last); ++i) {
                lines.push_back(opt.at(i));
            }
        } else {
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper list not found");
            // include our value and the first n-1 rows
            highlight_idx = 0;
            highlight = true;
            lines.push_back(V);
            for (size_t i = 0; ((i < nopt) && (i < (max_rows - 1))); ++i) {
                lines.push_back(opt.at(i));
            }
        }
    }

    // Write the lines centered vertically, highlighting if needed
    size_t nlines = lines.size();
    double dy = bbox.ury - ((bbox.ury - bbox.lly - (static_cast<double>(nlines) * tfh)) / 2.0);
    if (highlight) {
        write(
            "q\n0.85 0.85 0.85 rg\n" + QUtil::double_to_string(bbox.llx) + " " +
            QUtil::double_to_string(
                bbox.lly + dy - (tfh * (static_cast<double>(highlight_idx + 1)))) +
            " " + QUtil::double_to_string(bbox.urx - bbox.llx) + " " +
            QUtil::double_to_string(tfh) + " re f\nQ\n");
    }
    dy -= tf;
    write("q\nBT\n" + DA + "\n");
    for (size_t i = 0; i < nlines; ++i) {
        // We could adjust Tm to translate to the beginning the first line, set TL to tfh, and use
        // T* for each subsequent line, but doing this would require extracting any Tm from DA,
        // which doesn't seem really worth the effort.
        if (i == 0) {
            write(
                QUtil::double_to_string(bbox.llx + static_cast<double>(dx)) + " " +
                QUtil::double_to_string(bbox.lly + static_cast<double>(dy)) + " Td\n");
        } else {
            write("0 " + QUtil::double_to_string(-tfh) + " Td\n");
        }
        write(QPDFObjectHandle::newString(lines.at(i)).unparse() + " Tj\n");
    }
    write("ET\nQ\nEMC");
}